

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::analyze_precision_requirements
          (CompilerGLSL *this,uint32_t type_id,uint32_t dst_id,uint32_t *args,uint32_t length)

{
  bool bVar1;
  Precision PVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  ulong uVar5;
  
  if ((this->backend).requires_relaxed_precision_analysis == true) {
    pSVar4 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        type_id);
    if ((pSVar4->basetype < Double) &&
       ((0x2180U >> (pSVar4->basetype & (MeshGridProperties|Int)) & 1) != 0)) {
      bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)dst_id,DecorationRelaxedPrecision);
      PVar2 = analyze_expression_precision(this,args,length);
      if (PVar2 == DontCare) {
        consume_temporary_in_precision_context(this,type_id,dst_id,DontCare);
        return;
      }
      if ((PVar2 == bVar1 + Mediump) && (length != 0)) {
        uVar5 = 0;
        do {
          uVar3 = Compiler::expression_type_id(&this->super_Compiler,args[uVar5]);
          uVar3 = consume_temporary_in_precision_context(this,uVar3,args[uVar5],bVar1 ^ Highp);
          args[uVar5] = uVar3;
          uVar5 = uVar5 + 1;
        } while (length != uVar5);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::analyze_precision_requirements(uint32_t type_id, uint32_t dst_id, uint32_t *args, uint32_t length)
{
	if (!backend.requires_relaxed_precision_analysis)
		return;

	auto &type = get<SPIRType>(type_id);

	// RelaxedPrecision only applies to 32-bit values.
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::Int && type.basetype != SPIRType::UInt)
		return;

	bool operation_is_highp = !has_decoration(dst_id, DecorationRelaxedPrecision);

	auto input_precision = analyze_expression_precision(args, length);
	if (input_precision == Options::DontCare)
	{
		consume_temporary_in_precision_context(type_id, dst_id, input_precision);
		return;
	}

	// In SPIR-V and GLSL, the semantics are flipped for how relaxed precision is determined.
	// In SPIR-V, the operation itself marks RelaxedPrecision, meaning that inputs can be truncated to 16-bit.
	// However, if the expression is not, inputs must be expanded to 32-bit first,
	// since the operation must run at high precision.
	// This is the awkward part, because if we have mediump inputs, or expressions which derived from mediump,
	// we might have to forcefully bind the source IDs to highp temporaries. This is done by clearing decorations
	// and forcing temporaries. Similarly for mediump operations. We bind highp expressions to mediump variables.
	if ((operation_is_highp && input_precision == Options::Mediump) ||
	    (!operation_is_highp && input_precision == Options::Highp))
	{
		auto precision = operation_is_highp ? Options::Highp : Options::Mediump;
		for (uint32_t i = 0; i < length; i++)
		{
			// Rewrites the opcode so that we consume an ID in correct precision context.
			// This is pretty hacky, but it's the most straight forward way of implementing this without adding
			// lots of extra passes to rewrite all code blocks.
			args[i] = consume_temporary_in_precision_context(expression_type_id(args[i]), args[i], precision);
		}
	}
}